

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,OffsetBuffer *input,
                 int stream_id,int obj_id,Tokenizer *tokenizer,QPDF *context)

{
  bool empty;
  QPDFObjectHandle result;
  bool local_12a;
  allocator<char> local_129;
  ObjStreamDescr local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  pointer local_118;
  undefined1 local_110 [24];
  string local_f8;
  QPDFParser local_d8;
  
  local_12a = false;
  local_118 = (pointer)context;
  local_110._16_4_ = stream_id;
  local_110._20_4_ = obj_id;
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::ObjStreamDescr>
            (&local_128);
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_110 + 0x18),"",&local_129);
  local_d8.decrypter = (StringDecrypter *)0x0;
  local_d8.context = (QPDF *)local_118;
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_128;
  local_d8.description.
  super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Stack_120._M_pi;
  local_d8.parse_pdf = true;
  local_d8.sanity_checks = false;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.stack.super__Vector_base<QPDFParser::StackFrame,_std::allocator<QPDFParser::StackFrame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.frame = (StackFrame *)0x0;
  local_d8.bad_count = 0;
  local_d8.max_bad_count = 0xf;
  local_d8.good_count = 0;
  local_d8.start = 0;
  local_d8.int_count = 0;
  local_128.stream_id = 0;
  local_128.obj_id = 0;
  _Stack_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8.last_offset_buffer[0] = 0;
  local_d8.last_offset_buffer[1] = 0;
  local_d8.int_buffer[0] = 0;
  local_d8.int_buffer[1] = 0;
  local_d8.input = &input->super_InputSource;
  local_d8.object_description = (string *)(local_110 + 0x18);
  local_d8.tokenizer = tokenizer;
  local_d8.stream_id = stream_id;
  local_d8.obj_id = obj_id;
  parse((QPDFParser *)local_110,(bool *)&local_d8,SUB81(&local_12a,0));
  ~QPDFParser(&local_d8);
  std::__cxx11::string::~string((string *)(local_110 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_120);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_110);
  __return_storage_ptr__->second = local_12a;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_110 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    is::OffsetBuffer& input, int stream_id, int obj_id, qpdf::Tokenizer& tokenizer, QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      std::make_shared<QPDFObject::Description>(
                          QPDFObject::ObjStreamDescr(stream_id, obj_id)),
                      "",
                      tokenizer,
                      nullptr,
                      &context,
                      true,
                      stream_id,
                      obj_id)
                      .parse(empty, false);
    return {result, empty};
}